

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O2

Instr * __thiscall LowererMD::LowerToFloat(LowererMD *this,Instr *instr)

{
  code *pcVar1;
  AddrOpndKind addrOpndKind;
  IRType IVar2;
  bool bVar3;
  intptr_t pMemLoc;
  BranchInstr *pBVar4;
  undefined4 *puVar5;
  MemRefOpnd *newSrc;
  OpCode OVar6;
  Func *func;
  
  OVar6 = instr->m_opcode;
  if ((OVar6 - 0x194 < 8) || (OVar6 - 0x10 < 6)) {
LAB_005e0a54:
    pBVar4 = IR::Instr::AsBranchInstr(instr);
    pBVar4 = LowerFloatCondBranch(pBVar4,false);
    return &pBVar4->super_Instr;
  }
  switch(OVar6) {
  case Neg_A:
    instr->m_opcode = XORPS;
    IVar2 = instr->m_dst->m_type;
    if (IVar2 == TyFloat64) {
LAB_005e0e8a:
      pMemLoc = ThreadContextInfo::GetMaskNegDoubleAddr(this->m_func->m_threadContextInfo);
      func = this->m_func;
      IVar2 = TyFloat64;
      addrOpndKind = AddrOpndKindDynamicDoubleRef;
    }
    else {
      if (IVar2 != TyFloat32) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x1e26,"(instr->GetDst()->IsFloat64())","instr->GetDst()->IsFloat64()");
        if (!bVar3) goto LAB_005e0ecc;
        *puVar5 = 0;
        goto LAB_005e0e8a;
      }
      pMemLoc = ThreadContextInfo::GetMaskNegFloatAddr(this->m_func->m_threadContextInfo);
      func = this->m_func;
      IVar2 = TyFloat32;
      addrOpndKind = AddrOpndKindDynamicFloatRef;
    }
    newSrc = IR::MemRefOpnd::New(pMemLoc,IVar2,func,addrOpndKind);
    IR::Instr::SetSrc2(instr,&newSrc->super_Opnd);
    goto LAB_005e0eb4;
  case Not_A:
  case Typeof:
  case TypeofElem:
  case ApplyArgs:
  case ProfiledDiv_A:
  case Rem_A:
  case ProfiledRem_A:
    goto switchD_005e0a08_caseD_29;
  case Add_A:
    IVar2 = instr->m_dst->m_type;
    if (IVar2 != instr->m_src1->m_type) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x1e05,"(instr->GetDst()->GetType() == instr->GetSrc1()->GetType())",
                         "instr->GetDst()->GetType() == instr->GetSrc1()->GetType()");
      if (!bVar3) goto LAB_005e0ecc;
      *puVar5 = 0;
      IVar2 = instr->m_src1->m_type;
    }
    if (IVar2 != instr->m_src2->m_type) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x1e06,"(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType())",
                         "instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType()");
      if (!bVar3) goto LAB_005e0ecc;
      *puVar5 = 0;
      IVar2 = instr->m_src1->m_type;
    }
    OVar6 = IVar2 == TyFloat64 ^ ADDSS;
    break;
  case Div_A:
    IVar2 = instr->m_dst->m_type;
    if (IVar2 != instr->m_src1->m_type) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x1e17,"(instr->GetDst()->GetType() == instr->GetSrc1()->GetType())",
                         "instr->GetDst()->GetType() == instr->GetSrc1()->GetType()");
      if (!bVar3) goto LAB_005e0ecc;
      *puVar5 = 0;
      IVar2 = instr->m_src1->m_type;
    }
    if (IVar2 != instr->m_src2->m_type) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x1e18,"(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType())",
                         "instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType()");
      if (!bVar3) goto LAB_005e0ecc;
      *puVar5 = 0;
      IVar2 = instr->m_src1->m_type;
    }
    OVar6 = IVar2 == TyFloat64 ^ DIVSS;
    break;
  case Mul_A:
    IVar2 = instr->m_dst->m_type;
    if (IVar2 != instr->m_src1->m_type) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x1e11,"(instr->GetDst()->GetType() == instr->GetSrc1()->GetType())",
                         "instr->GetDst()->GetType() == instr->GetSrc1()->GetType()");
      if (!bVar3) goto LAB_005e0ecc;
      *puVar5 = 0;
      IVar2 = instr->m_src1->m_type;
    }
    if (IVar2 != instr->m_src2->m_type) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x1e12,"(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType())",
                         "instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType()");
      if (!bVar3) goto LAB_005e0ecc;
      *puVar5 = 0;
      IVar2 = instr->m_src1->m_type;
    }
    OVar6 = (IVar2 != TyFloat64) + MULSD;
    break;
  case Sub_A:
    IVar2 = instr->m_dst->m_type;
    if (IVar2 != instr->m_src1->m_type) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x1e0b,"(instr->GetDst()->GetType() == instr->GetSrc1()->GetType())",
                         "instr->GetDst()->GetType() == instr->GetSrc1()->GetType()");
      if (!bVar3) goto LAB_005e0ecc;
      *puVar5 = 0;
      IVar2 = instr->m_src1->m_type;
    }
    if (IVar2 != instr->m_src2->m_type) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x1e0c,"(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType())",
                         "instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType()");
      if (!bVar3) goto LAB_005e0ecc;
      *puVar5 = 0;
      IVar2 = instr->m_src1->m_type;
    }
    OVar6 = IVar2 == TyFloat64 ^ SUBSS;
    break;
  default:
    if (OVar6 - 0xc < 2) goto LAB_005e0a54;
    goto switchD_005e0a08_caseD_29;
  }
  instr->m_opcode = OVar6;
LAB_005e0eb4:
  Legalize<false>(instr,false);
  return instr;
switchD_005e0a08_caseD_29:
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar5 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                     ,0x1e40,"((0))","(0)");
  if (!bVar3) {
LAB_005e0ecc:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar5 = 0;
  goto LAB_005e0eb4;
}

Assistant:

IR::Instr *
LowererMD::LowerToFloat(IR::Instr *instr)
{
    switch (instr->m_opcode)
    {
    case Js::OpCode::Add_A:
        Assert(instr->GetDst()->GetType() == instr->GetSrc1()->GetType());
        Assert(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType());
        instr->m_opcode = instr->GetSrc1()->IsFloat64() ? Js::OpCode::ADDSD : Js::OpCode::ADDSS;
        break;

    case Js::OpCode::Sub_A:
        Assert(instr->GetDst()->GetType() == instr->GetSrc1()->GetType());
        Assert(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType());
        instr->m_opcode = instr->GetSrc1()->IsFloat64() ? Js::OpCode::SUBSD : Js::OpCode::SUBSS;
        break;

    case Js::OpCode::Mul_A:
        Assert(instr->GetDst()->GetType() == instr->GetSrc1()->GetType());
        Assert(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType());
        instr->m_opcode = instr->GetSrc1()->IsFloat64() ? Js::OpCode::MULSD : Js::OpCode::MULSS;
        break;

    case Js::OpCode::Div_A:
        Assert(instr->GetDst()->GetType() == instr->GetSrc1()->GetType());
        Assert(instr->GetSrc1()->GetType() == instr->GetSrc2()->GetType());
        instr->m_opcode = instr->GetSrc1()->IsFloat64() ? Js::OpCode::DIVSD : Js::OpCode::DIVSS;
        break;

    case Js::OpCode::Neg_A:
    {
        IR::Opnd *opnd;
        instr->m_opcode = Js::OpCode::XORPS;
        if (instr->GetDst()->IsFloat32())
        {
            opnd = IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetMaskNegFloatAddr(), TyFloat32, this->m_func, IR::AddrOpndKindDynamicFloatRef);
        }
        else
        {
            Assert(instr->GetDst()->IsFloat64());
            opnd = IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetMaskNegDoubleAddr(), TyMachDouble, this->m_func, IR::AddrOpndKindDynamicDoubleRef);
        }
        instr->SetSrc2(opnd);
        break;
    }

    case Js::OpCode::BrEq_A:
    case Js::OpCode::BrNeq_A:
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrGt_A:
    case Js::OpCode::BrGe_A:
    case Js::OpCode::BrLt_A:
    case Js::OpCode::BrLe_A:
    case Js::OpCode::BrNotEq_A:
    case Js::OpCode::BrNotNeq_A:
    case Js::OpCode::BrSrNotEq_A:
    case Js::OpCode::BrSrNotNeq_A:
    case Js::OpCode::BrNotGt_A:
    case Js::OpCode::BrNotGe_A:
    case Js::OpCode::BrNotLt_A:
    case Js::OpCode::BrNotLe_A:
        return this->LowerFloatCondBranch(instr->AsBranchInstr());

    default:
        Assume(UNREACHED);
    }

    Legalize(instr);

    return instr;
}